

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_context.c
# Opt level: O2

int test_contexts_digest_or_legacy_mac(EVP_MD *type,int mac)

{
  int iVar1;
  int iVar2;
  EVP_MD_CTX *ctx;
  EVP_MD_CTX *out;
  char *__s;
  long lVar3;
  char *__s_00;
  EVP_MD_CTX *in;
  uint tmplen;
  uchar c [64];
  uchar b [64];
  uchar K [32];
  uchar pt [256];
  
  K[0x10] = '\0';
  K[0x11] = '\0';
  K[0x12] = '\0';
  K[0x13] = '\0';
  K[0x14] = '\0';
  K[0x15] = '\0';
  K[0x16] = '\0';
  K[0x17] = '\0';
  K[0x18] = '\0';
  K[0x19] = '\0';
  K[0x1a] = '\0';
  K[0x1b] = '\0';
  K[0x1c] = '\0';
  K[0x1d] = '\0';
  K[0x1e] = '\0';
  K[0x1f] = '\0';
  K[0] = '\x01';
  K[1] = '\0';
  K[2] = '\0';
  K[3] = '\0';
  K[4] = '\0';
  K[5] = '\0';
  K[6] = '\0';
  K[7] = '\0';
  K[8] = '\0';
  K[9] = '\0';
  K[10] = '\0';
  K[0xb] = '\0';
  K[0xc] = '\0';
  K[0xd] = '\0';
  K[0xe] = '\0';
  K[0xf] = '\0';
  memset(pt,0,0x100);
  pt[0] = '\x01';
  b[0x30] = '\0';
  b[0x31] = '\0';
  b[0x32] = '\0';
  b[0x33] = '\0';
  b[0x34] = '\0';
  b[0x35] = '\0';
  b[0x36] = '\0';
  b[0x37] = '\0';
  b[0x38] = '\0';
  b[0x39] = '\0';
  b[0x3a] = '\0';
  b[0x3b] = '\0';
  b[0x3c] = '\0';
  b[0x3d] = '\0';
  b[0x3e] = '\0';
  b[0x3f] = '\0';
  b[0x20] = '\0';
  b[0x21] = '\0';
  b[0x22] = '\0';
  b[0x23] = '\0';
  b[0x24] = '\0';
  b[0x25] = '\0';
  b[0x26] = '\0';
  b[0x27] = '\0';
  b[0x28] = '\0';
  b[0x29] = '\0';
  b[0x2a] = '\0';
  b[0x2b] = '\0';
  b[0x2c] = '\0';
  b[0x2d] = '\0';
  b[0x2e] = '\0';
  b[0x2f] = '\0';
  b[0x10] = '\0';
  b[0x11] = '\0';
  b[0x12] = '\0';
  b[0x13] = '\0';
  b[0x14] = '\0';
  b[0x15] = '\0';
  b[0x16] = '\0';
  b[0x17] = '\0';
  b[0x18] = '\0';
  b[0x19] = '\0';
  b[0x1a] = '\0';
  b[0x1b] = '\0';
  b[0x1c] = '\0';
  b[0x1d] = '\0';
  b[0x1e] = '\0';
  b[0x1f] = '\0';
  b[0] = '\0';
  b[1] = '\0';
  b[2] = '\0';
  b[3] = '\0';
  b[4] = '\0';
  b[5] = '\0';
  b[6] = '\0';
  b[7] = '\0';
  b[8] = '\0';
  b[9] = '\0';
  b[10] = '\0';
  b[0xb] = '\0';
  b[0xc] = '\0';
  b[0xd] = '\0';
  b[0xe] = '\0';
  b[0xf] = '\0';
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  if (ctx == (EVP_MD_CTX *)0x0) {
LAB_001034ca:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("ctx = EVP_MD_CTX_new()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0xae);
LAB_001034f1:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestInit_ex(ctx, type, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0xaf);
LAB_00103518:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestUpdate(ctx, pt, sizeof(pt))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0xb2);
LAB_0010353f:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestFinal_ex(ctx, b, &tmplen)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0xb3);
LAB_00103566:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestInit_ex(ctx, type, NULL)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0xb9);
LAB_0010358d:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestFinal_ex(ctx, c, &tmplen)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0xcd);
LAB_001035b4:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestUpdate(save, pt, sizeof(pt))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0xdc);
LAB_001035db:
    ERR_print_errors_fp(_stderr);
    OPENSSL_die("EVP_DigestFinal_ex(save, c, &tmplen)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                ,0xdd);
  }
  else {
    iVar1 = EVP_DigestInit_ex(ctx,(EVP_MD *)type,(ENGINE *)0x0);
    if (iVar1 == 0) goto LAB_001034f1;
    if (mac == 0) {
LAB_001031c4:
      iVar1 = EVP_DigestUpdate(ctx,pt,0x100);
      if (iVar1 == 0) goto LAB_00103518;
      iVar1 = EVP_DigestFinal_ex(ctx,b,&tmplen);
      if (iVar1 == 0) goto LAB_0010353f;
      EVP_MD_CTX_reset(ctx);
      EVP_MD_CTX_reset(ctx);
      iVar1 = EVP_DigestInit_ex(ctx,(EVP_MD *)type,(ENGINE *)0x0);
      if (iVar1 == 0) goto LAB_00103566;
      if (mac != 0) {
        iVar1 = EVP_MD_CTX_ctrl(ctx,0x1004,0x20,K);
        if (iVar1 == 0) goto LAB_00103629;
      }
      printf(" cloned contexts: ");
      c[0] = '\0';
      c[1] = '\0';
      c[2] = '\0';
      c[3] = '\0';
      c[4] = '\0';
      c[5] = '\0';
      c[6] = '\0';
      c[7] = '\0';
      c[8] = '\0';
      c[9] = '\0';
      c[10] = '\0';
      c[0xb] = '\0';
      c[0xc] = '\0';
      c[0xd] = '\0';
      c[0xe] = '\0';
      c[0xf] = '\0';
      c[0x10] = '\0';
      c[0x11] = '\0';
      c[0x12] = '\0';
      c[0x13] = '\0';
      c[0x14] = '\0';
      c[0x15] = '\0';
      c[0x16] = '\0';
      c[0x17] = '\0';
      c[0x18] = '\0';
      c[0x19] = '\0';
      c[0x1a] = '\0';
      c[0x1b] = '\0';
      c[0x1c] = '\0';
      c[0x1d] = '\0';
      c[0x1e] = '\0';
      c[0x1f] = '\0';
      c[0x20] = '\0';
      c[0x21] = '\0';
      c[0x22] = '\0';
      c[0x23] = '\0';
      c[0x24] = '\0';
      c[0x25] = '\0';
      c[0x26] = '\0';
      c[0x27] = '\0';
      c[0x28] = '\0';
      c[0x29] = '\0';
      c[0x2a] = '\0';
      c[0x2b] = '\0';
      c[0x2c] = '\0';
      c[0x2d] = '\0';
      c[0x2e] = '\0';
      c[0x2f] = '\0';
      c[0x30] = '\0';
      c[0x31] = '\0';
      c[0x32] = '\0';
      c[0x33] = '\0';
      c[0x34] = '\0';
      c[0x35] = '\0';
      c[0x36] = '\0';
      c[0x37] = '\0';
      c[0x38] = '\0';
      c[0x39] = '\0';
      c[0x3a] = '\0';
      c[0x3b] = '\0';
      c[0x3c] = '\0';
      c[0x3d] = '\0';
      c[0x3e] = '\0';
      c[0x3f] = '\0';
      lVar3 = 0;
      in = ctx;
      do {
        out = in;
        if (lVar3 + 0x10 == 0x110) goto LAB_001032f8;
        out = (EVP_MD_CTX *)EVP_MD_CTX_new();
        if (out == (EVP_MD_CTX *)0x0) {
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("copy = EVP_MD_CTX_new()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                      ,0xc2);
LAB_001034a3:
          ERR_print_errors_fp(_stderr);
          OPENSSL_die("EVP_MD_CTX_copy_ex(copy, ctx)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                      ,0xc3);
          goto LAB_001034ca;
        }
        iVar1 = EVP_MD_CTX_copy_ex(out,in);
        if (iVar1 == 0) goto LAB_001034a3;
        if (ctx != in) {
          EVP_MD_CTX_free(in);
        }
        iVar1 = EVP_DigestUpdate(out,pt + lVar3,0x10);
        lVar3 = lVar3 + 0x10;
        in = out;
      } while (iVar1 != 0);
      ERR_print_errors_fp(_stderr);
      OPENSSL_die("EVP_DigestUpdate(ctx, pt + STEP_SIZE * i, STEP_SIZE)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                  ,0xca);
LAB_001032f8:
      iVar1 = EVP_DigestFinal_ex(out,c,&tmplen);
      if (iVar1 == 0) goto LAB_0010358d;
      iVar1 = bcmp(c,b,0x40);
      __s_00 = "\x1b[1;31m  Test FAILED\x1b[m";
      __s = "\x1b[1;31m  Test FAILED\x1b[m";
      if (iVar1 == 0) {
        __s = "\x1b[1;32m  Test passed\x1b[m";
      }
      puts(__s);
      EVP_MD_CTX_free(out);
      if (iVar1 != 0) {
        printf("  b[%d] = ",0x100);
        hexdump(b,0x100);
        printf("  c[%d] = ",0x100);
        hexdump(c,0x100);
      }
      printf("    base context: ");
      c[0] = '\0';
      c[1] = '\0';
      c[2] = '\0';
      c[3] = '\0';
      c[4] = '\0';
      c[5] = '\0';
      c[6] = '\0';
      c[7] = '\0';
      c[8] = '\0';
      c[9] = '\0';
      c[10] = '\0';
      c[0xb] = '\0';
      c[0xc] = '\0';
      c[0xd] = '\0';
      c[0xe] = '\0';
      c[0xf] = '\0';
      c[0x10] = '\0';
      c[0x11] = '\0';
      c[0x12] = '\0';
      c[0x13] = '\0';
      c[0x14] = '\0';
      c[0x15] = '\0';
      c[0x16] = '\0';
      c[0x17] = '\0';
      c[0x18] = '\0';
      c[0x19] = '\0';
      c[0x1a] = '\0';
      c[0x1b] = '\0';
      c[0x1c] = '\0';
      c[0x1d] = '\0';
      c[0x1e] = '\0';
      c[0x1f] = '\0';
      c[0x20] = '\0';
      c[0x21] = '\0';
      c[0x22] = '\0';
      c[0x23] = '\0';
      c[0x24] = '\0';
      c[0x25] = '\0';
      c[0x26] = '\0';
      c[0x27] = '\0';
      c[0x28] = '\0';
      c[0x29] = '\0';
      c[0x2a] = '\0';
      c[0x2b] = '\0';
      c[0x2c] = '\0';
      c[0x2d] = '\0';
      c[0x2e] = '\0';
      c[0x2f] = '\0';
      c[0x30] = '\0';
      c[0x31] = '\0';
      c[0x32] = '\0';
      c[0x33] = '\0';
      c[0x34] = '\0';
      c[0x35] = '\0';
      c[0x36] = '\0';
      c[0x37] = '\0';
      c[0x38] = '\0';
      c[0x39] = '\0';
      c[0x3a] = '\0';
      c[0x3b] = '\0';
      c[0x3c] = '\0';
      c[0x3d] = '\0';
      c[0x3e] = '\0';
      c[0x3f] = '\0';
      iVar2 = EVP_DigestUpdate(ctx,pt,0x100);
      if (iVar2 == 0) goto LAB_001035b4;
      iVar2 = EVP_DigestFinal_ex(ctx,c,&tmplen);
      if (iVar2 != 0) {
        iVar2 = bcmp(c,b,0x40);
        if (iVar2 == 0) {
          __s_00 = "\x1b[1;32m  Test passed\x1b[m";
        }
        puts(__s_00);
        EVP_MD_CTX_free(ctx);
        if (iVar2 != 0) {
          printf("  b[%d] = ",0x100);
          hexdump(b,0x100);
          printf("  c[%d] = ",0x100);
          hexdump(c,0x100);
        }
        return (int)(iVar2 != 0 || iVar1 != 0);
      }
      goto LAB_001035db;
    }
    iVar1 = EVP_MD_CTX_ctrl(ctx,0x1004,0x20,K);
    if (iVar1 != 0) goto LAB_001031c4;
  }
  ERR_print_errors_fp(_stderr);
  OPENSSL_die("EVP_MD_CTX_ctrl(ctx, EVP_MD_CTRL_SET_KEY, sizeof(K), (void *)K)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
              ,0xb1);
LAB_00103629:
  ERR_print_errors_fp(_stderr);
  iVar1 = OPENSSL_die("EVP_MD_CTX_ctrl(ctx, EVP_MD_CTRL_SET_KEY, sizeof(K), (void *)K)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/levitte[P]engine/test_context.c"
                      ,0xbb);
  return iVar1;
}

Assistant:

static int test_contexts_digest_or_legacy_mac(const EVP_MD *type, int mac)
{
    int ret = 0, test = 0;
    unsigned char K[32] = {1};

    /* produce base digest */
    EVP_MD_CTX *ctx, *save;
    unsigned char pt[TEST_SIZE] = {1};
    unsigned char b[EVP_MAX_MD_SIZE] = {0};
    unsigned char c[EVP_MAX_MD_SIZE];
    unsigned int outlen, tmplen;

    /* Simply digest whole input. */
    T(ctx = EVP_MD_CTX_new());
    T(EVP_DigestInit_ex(ctx, type, NULL));
    if (mac)
	T(EVP_MD_CTX_ctrl(ctx, EVP_MD_CTRL_SET_KEY, sizeof(K), (void *)K));
    T(EVP_DigestUpdate(ctx, pt, sizeof(pt)));
    T(EVP_DigestFinal_ex(ctx, b, &tmplen));
    save = ctx; /* will be not freed while cloning */

    /* cloned digest */
    EVP_MD_CTX_reset(ctx); /* test double reset */
    EVP_MD_CTX_reset(ctx);
    T(EVP_DigestInit_ex(ctx, type, NULL));
    if (mac)
	T(EVP_MD_CTX_ctrl(ctx, EVP_MD_CTRL_SET_KEY, sizeof(K), (void *)K));
    printf(" cloned contexts: ");
    memset(c, 0, sizeof(c));
    int i;
    for (i = 0; i < TEST_SIZE / STEP_SIZE; i++) {
	/* Clone and continue digesting next part of input. */
	EVP_MD_CTX *copy;
	T(copy = EVP_MD_CTX_new());
	T(EVP_MD_CTX_copy_ex(copy, ctx));

	/* rolling */
	if (save != ctx)
	    EVP_MD_CTX_free(ctx);
	ctx = copy;

	T(EVP_DigestUpdate(ctx, pt + STEP_SIZE * i, STEP_SIZE));
    }
    outlen = i * STEP_SIZE;
    T(EVP_DigestFinal_ex(ctx, c, &tmplen));
    /* Should be same as the simple digest. */
    TEST_ASSERT(outlen != TEST_SIZE || memcmp(c, b, EVP_MAX_MD_SIZE));
    EVP_MD_CTX_free(ctx);
    if (test) {
	printf("  b[%d] = ", outlen);
	hexdump(b, outlen);
	printf("  c[%d] = ", outlen);
	hexdump(c, outlen);
    }
    ret |= test;

    /* Resume original context, what if it's damaged? */
    printf("    base context: ");
    memset(c, 0, sizeof(c));
    T(EVP_DigestUpdate(save, pt, sizeof(pt)));
    T(EVP_DigestFinal_ex(save, c, &tmplen));
    TEST_ASSERT(outlen != TEST_SIZE || memcmp(c, b, EVP_MAX_MD_SIZE));
    EVP_MD_CTX_free(save);
    if (test) {
	printf("  b[%d] = ", outlen);
	hexdump(b, outlen);
	printf("  c[%d] = ", outlen);
	hexdump(c, outlen);
    }
    ret |= test;

    return ret;
}